

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.cpp
# Opt level: O0

void vera::blendMode(BlendMode _mode)

{
  BlendMode _mode_local;
  
  switch(_mode) {
  case BLEND_NONE:
    glDisable(0xbe2);
    break;
  case BLEND_ALPHA:
    glEnable(0xbe2);
    glBlendFunc(0x302,0x303);
    break;
  case BLEND_ADD:
    glEnable(0xbe2);
    glBlendEquation(0x8006);
    glBlendFunc(0x302,1);
    break;
  case BLEND_MULTIPLY:
    glEnable(0xbe2);
    glBlendEquation(0x8006);
    glBlendFunc(0x306,0x303);
    break;
  case BLEND_SCREEN:
    glEnable(0xbe2);
    glBlendEquation(0x8006);
    glBlendFunc(0x307,1);
    break;
  case BLEND_SUBSTRACT:
    glEnable(0xbe2);
    glBlendEquation(0x800b);
    glBlendFunc(0x302,1);
  }
  return;
}

Assistant:

void blendMode( BlendMode _mode ) {
    switch (_mode) {
        case BLEND_ALPHA:
            glEnable(GL_BLEND);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
            break;

        case BLEND_ADD:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE);
            break;

        case BLEND_MULTIPLY:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA /* GL_ZERO or GL_ONE_MINUS_SRC_ALPHA */);
            break;

        case BLEND_SCREEN:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_ADD);
            glBlendFunc(GL_ONE_MINUS_DST_COLOR, GL_ONE);
            break;

        case BLEND_SUBSTRACT:
            glEnable(GL_BLEND);
            glBlendEquation(GL_FUNC_REVERSE_SUBTRACT);
            glBlendFunc(GL_SRC_ALPHA, GL_ONE);
            break;

        case BLEND_NONE:
            glDisable(GL_BLEND);
            break;

        default:
            break;
    }
}